

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_earthbind(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA local_80;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (!bVar1) {
    bVar1 = is_affected_by((CHAR_DATA *)vo,0x13);
    if (bVar1) {
      bVar1 = saves_spell(level,(CHAR_DATA *)vo,0x10);
      if (!bVar1) {
        init_affect(&local_80);
        local_80.where = 0;
        local_80.aftype = 0;
        local_80.type = gsn_earthbind;
        local_80.duration =
             (short)(uint)((ulong)((long)level * 0x66666667) >> 0x21) - (short)(level >> 0x1f);
        local_80.location = 0;
        local_80.modifier = 0;
        local_80.mod_name = 4;
        local_80.level = (short)level;
        affect_to_char((CHAR_DATA *)vo,&local_80);
        send_to_char("Your feet suddenly become heavy and earthbound.\n\r",(CHAR_DATA *)vo);
        act("$n suddenly drops to the ground.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
        return;
      }
      txt = "Spell failed.\n\r";
      goto LAB_002b4240;
    }
  }
  txt = "Their feet are already on the ground.\n\r";
LAB_002b4240:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_earthbind(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	if (is_affected(victim, sn) || !is_affected_by(victim, AFF_FLYING))
	{
		send_to_char("Their feet are already on the ground.\n\r", ch);
		return;
	}

	if (saves_spell(level, victim, DAM_OTHER))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_earthbind;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 5;
	af.location = 0;
	af.mod_name = MOD_LEVITATION;
	affect_to_char(victim, &af);

	send_to_char("Your feet suddenly become heavy and earthbound.\n\r", victim);
	act("$n suddenly drops to the ground.", victim, 0, 0, TO_ROOM);
}